

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Type __thiscall wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  uint uVar2;
  HeapType HVar3;
  HeapType HVar4;
  ulong uVar5;
  ulong uVar6;
  Type local_30;
  Type type_local;
  
  local_30.id = type.id;
  HVar3 = Type::getHeapType(&local_30);
  HVar3 = getSuperType(this,HVar3);
  uVar5 = 2;
  if ((local_30.id < 7 || ((uint)local_30.id & 3) != 2) && (((byte)this->wasm[0x179] & 4) != 0)) {
    uVar1 = Random::upTo(&this->random,2);
    if (uVar1 == 0) {
      uVar5 = 0;
    }
  }
  if (((uint)(0x7c < HVar3.id) * 4 + 3 & (uint)HVar3.id) == 0) {
    uVar6 = uVar5 | HVar3.id;
    if ((uVar5 == 0 && (HVar3.id & 3) == 0) && 6 < uVar6) {
      type_local.id = uVar6;
      HVar4 = Type::getHeapType(&type_local);
      if ((HVar4.id < 0x7d) &&
         (uVar2 = (uint)HVar4.id & 0x7b, (uVar2 << 0x1d | uVar2 - 8 >> 3) - 10 < 5)) {
        uVar6 = HVar3.id | 2;
      }
    }
    return (Type)uVar6;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

Type TranslateToFuzzReader::getSuperType(Type type) {
  auto heapType = getSuperType(type.getHeapType());
  auto nullability = getSuperType(type.getNullability());
  auto superType = Type(heapType, nullability);
  // As with getSubType, we want to avoid returning an uninhabitable type where
  // possible. Here all we can do is flip the super's nullability to nullable.
  if (GCTypeUtils::isUninhabitable(superType)) {
    superType = Type(heapType, Nullable);
  }
  return superType;
}